

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

cmLinkItem * __thiscall
cmComputeLinkDepends::ResolveLinkItem
          (cmLinkItem *__return_storage_ptr__,cmComputeLinkDepends *this,int depender_index,
          string *name)

{
  cmGeneratorTarget *this_00;
  cmGeneratorTarget *name_00;
  reference pvVar1;
  cmListFileBacktrace local_48;
  cmGeneratorTarget *local_38;
  cmGeneratorTarget *depender;
  cmGeneratorTarget *from;
  string *name_local;
  cmComputeLinkDepends *pcStack_18;
  int depender_index_local;
  cmComputeLinkDepends *this_local;
  
  depender = this->Target;
  from = (cmGeneratorTarget *)name;
  name_local._4_4_ = depender_index;
  pcStack_18 = this;
  this_local = (cmComputeLinkDepends *)__return_storage_ptr__;
  if (-1 < depender_index) {
    pvVar1 = std::
             vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ::operator[](&this->EntryList,(long)depender_index);
    local_38 = pvVar1->Target;
    if (local_38 != (cmGeneratorTarget *)0x0) {
      depender = local_38;
    }
  }
  name_00 = from;
  this_00 = depender;
  local_48.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_48.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmListFileBacktrace::cmListFileBacktrace(&local_48);
  cmGeneratorTarget::ResolveLinkItem(__return_storage_ptr__,this_00,(string *)name_00,&local_48);
  cmListFileBacktrace::~cmListFileBacktrace(&local_48);
  return __return_storage_ptr__;
}

Assistant:

cmLinkItem cmComputeLinkDepends::ResolveLinkItem(int depender_index,
                                                 const std::string& name)
{
  // Look for a target in the scope of the depender.
  cmGeneratorTarget const* from = this->Target;
  if (depender_index >= 0) {
    if (cmGeneratorTarget const* depender =
          this->EntryList[depender_index].Target) {
      from = depender;
    }
  }
  return from->ResolveLinkItem(name, cmListFileBacktrace());
}